

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O2

void __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
::do_queue_processing
          (work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
           *this,agent_queue_t *current_queue)

{
  emptyness_t eVar1;
  
  do {
    eVar1 = process_queue(this,current_queue);
    if (eVar1 != not_empty) {
      return;
    }
    current_queue =
         reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>::
         try_switch_to_another
                   ((this->super_with_activity_tracking_impl_t).super_common_data_t.m_disp_queue,
                    current_queue);
  } while (current_queue != (agent_queue_t *)0x0);
  return;
}

Assistant:

void
		do_queue_processing( agent_queue_t * current_queue )
			{
				do
					{
						const auto e = this->process_queue( *current_queue );

						if( agent_queue_t::emptyness_t::not_empty == e )
							{
								// We can continue processing of that queue if
								// there is no more non-empty queues waiting.
								current_queue =
									this->m_disp_queue->try_switch_to_another(
										current_queue );
							}
						else
							// Handling of the current queue should be stopped.
							current_queue = nullptr;
					}
				while( current_queue != nullptr );
			}